

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileStream.cpp
# Opt level: O0

void __thiscall TPZFileStream::WriteData<Fad<float>>(TPZFileStream *this,Fad<float> *p,int howMany)

{
  ostream *this_00;
  int in_EDX;
  Fad<float> *in_stack_00000008;
  int c;
  int local_18;
  
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    this_00 = ::operator<<((ostream *)CONCAT44(howMany,c),in_stack_00000008);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void  TPZFileStream::WriteData(const T *p, int howMany){
        for(int c=0; c<howMany; c++) fOut << p[c] << std::endl;
#ifdef PZDEBUG
        if (fOut.bad()) {
            PZError << "TFileStream:Could not write to stream" << std::endl;
            DebugStop();
        }
#endif
    }